

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O0

void microatf_context_write_result_pack
               (microatf_context_t *context,char *result,int arg,char *reason,__va_list_tag *args)

{
  int iVar1;
  int local_43c;
  int r;
  int line_size;
  char line [1024];
  __va_list_tag *args_local;
  char *reason_local;
  int arg_local;
  char *result_local;
  microatf_context_t *context_local;
  
  if (context->result_file < 0) {
    return;
  }
  if (((context->do_close_result_file & 1U) != 0) &&
     (iVar1 = ftruncate(context->result_file,0), iVar1 < 0)) {
    return;
  }
  local_43c = snprintf((char *)&r,0x400,"%s",result);
  if (local_43c < 0) {
    return;
  }
  if (0x3ff < local_43c) {
    return;
  }
  if (arg != -1) {
    iVar1 = snprintf((char *)((long)&r + (long)local_43c),(long)(0x400 - local_43c),"(%d)",
                     (ulong)(uint)arg);
    if (iVar1 < 0) {
      return;
    }
    if (0x400 - local_43c <= iVar1) {
      return;
    }
    local_43c = iVar1 + local_43c;
  }
  if (reason != (char *)0x0) {
    iVar1 = snprintf((char *)((long)&r + (long)local_43c),(long)(0x400 - local_43c),": ");
    if (iVar1 < 0) {
      return;
    }
    if (0x400 - local_43c <= iVar1) {
      return;
    }
    iVar1 = iVar1 + local_43c;
    local_43c = vsnprintf((char *)((long)&r + (long)iVar1),(long)(0x400 - iVar1),reason,args);
    if (local_43c < 0) {
      return;
    }
    if (0x400 - iVar1 <= local_43c) {
      return;
    }
    local_43c = local_43c + iVar1;
  }
  iVar1 = snprintf((char *)((long)&r + (long)local_43c),(long)(0x400 - local_43c),"\n");
  if ((-1 < iVar1) && (iVar1 < 0x400 - local_43c)) {
    write(context->result_file,&r,(long)(iVar1 + local_43c));
  }
  return;
}

Assistant:

static void
microatf_context_write_result_pack(microatf_context_t *context,
    char const *result, const int arg, char const *reason, va_list args)
{
	if (context->result_file < 0) {
		return;
	}

	if (context->do_close_result_file) {
		if (ftruncate(context->result_file, 0) < 0) {
			return;
		}
	}

	char line[1024];
	int line_size = 0;
	int r;

#define APP_IMPL(print_fun, ...)                                           \
	do {                                                               \
		r = print_fun(line + line_size, /**/                       \
		    (size_t)((int)sizeof(line) - line_size), __VA_ARGS__); \
		if (r < 0 || r >= ((int)sizeof(line) - line_size)) {       \
			return;                                            \
		}                                                          \
                                                                           \
		line_size += r;                                            \
	}